

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderControlStatementTests.cpp
# Opt level: O0

void __thiscall deqp::gles3::Performance::LoopCase::setupProgram(LoopCase *this,deUint32 program)

{
  code *pcVar1;
  int iVar2;
  undefined4 uVar3;
  deUint32 err;
  undefined4 extraout_var;
  size_type sVar5;
  reference pvVar6;
  int boundAttribLocation;
  int numComponents;
  int location;
  float loopBound;
  Functions *gl;
  deUint32 program_local;
  LoopCase *this_local;
  long lVar4;
  
  iVar2 = (*((this->super_ControlStatementCase).super_ShaderPerformanceCase.m_renderCtx)->
            _vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  if (this->m_decisionType == DECISION_UNIFORM) {
    uVar3 = (**(code **)(lVar4 + 0xb48))(program,"u_bound");
    (**(code **)(lVar4 + 0x14e0))(0x41280000,uVar3);
  }
  else if (((this->m_decisionType == DECISION_ATTRIBUTE) && ((this->m_isLoopBoundStable & 1U) == 0))
          && ((this->super_ControlStatementCase).super_ShaderPerformanceCase.m_caseType ==
              CASETYPE_VERTEX)) {
    uVar3 = (**(code **)(lVar4 + 0x780))(program,"a_bound");
    (**(code **)(lVar4 + 0x6c8))(1,&this->m_arrayBuffer);
    (**(code **)(lVar4 + 0x40))(0x8892,this->m_arrayBuffer);
    pcVar1 = *(code **)(lVar4 + 0x150);
    sVar5 = std::vector<float,_std::allocator<float>_>::size(&this->m_boundArray);
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](&this->m_boundArray,0);
    (*pcVar1)(0x8892,sVar5 << 2,pvVar6,0x88e4);
    (**(code **)(lVar4 + 0x610))(uVar3);
    (**(code **)(lVar4 + 0x19f0))(uVar3,4,0x1406,0,0,0);
  }
  err = (**(code **)(lVar4 + 0x800))();
  glu::checkError(err,"Setup program state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pShaderControlStatementTests.cpp"
                  ,0x28c);
  return;
}

Assistant:

void LoopCase::setupProgram (deUint32 program)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	if (m_decisionType == DECISION_UNIFORM)
	{
		const float loopBound = 10.5f;

		int location = gl.getUniformLocation(program, "u_bound");
		gl.uniform1f(location, loopBound);
	}
	else if (m_decisionType == DECISION_ATTRIBUTE && !m_isLoopBoundStable && m_caseType == CASETYPE_VERTEX)
	{
		// Setup per-vertex loop bounds calculated in init().

		const int	numComponents		= 4;
		int			boundAttribLocation	= gl.getAttribLocation(program, "a_bound");

		DE_ASSERT((int)m_boundArray.size() == numComponents * (getGridWidth() + 1) * (getGridHeight() + 1));

		gl.genBuffers(1, &m_arrayBuffer);
		gl.bindBuffer(GL_ARRAY_BUFFER, m_arrayBuffer);
		gl.bufferData(GL_ARRAY_BUFFER, (GLsizeiptr)(m_boundArray.size()*sizeof(float)), &m_boundArray[0], GL_STATIC_DRAW);
		gl.enableVertexAttribArray(boundAttribLocation);
		gl.vertexAttribPointer(boundAttribLocation, (GLint)numComponents, GL_FLOAT, GL_FALSE, 0, DE_NULL);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Setup program state");
}